

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileManager.cpp
# Opt level: O2

bool __thiscall
GenericAssemblerFile::seekPhysical(GenericAssemblerFile *this,int64_t physicalAddress)

{
  int iVar1;
  long lVar2;
  
  if (physicalAddress < 0) {
    Logger::queueError<>(Error,"Seeking to negative physical address");
  }
  else {
    lVar2 = this->headerSize + physicalAddress;
    if (lVar2 < 0) {
      Logger::queueError<>(Warning,"Seeking to physical address with negative virtual address");
      lVar2 = this->headerSize + physicalAddress;
    }
    this->virtualAddress = lVar2;
    iVar1 = (*(this->super_AssemblerFile)._vptr_AssemblerFile[4])(this);
    if ((char)iVar1 != '\0') {
      std::ostream::seekp(&this->stream,physicalAddress,0);
    }
  }
  return -1 < physicalAddress;
}

Assistant:

bool GenericAssemblerFile::seekPhysical(int64_t physicalAddress)
{
	if (physicalAddress < 0)
	{
		Logger::queueError(Logger::Error, "Seeking to negative physical address");
		return false;
	}
	if (physicalAddress + headerSize < 0)
		Logger::queueError(Logger::Warning, "Seeking to physical address with negative virtual address");

	virtualAddress = physicalAddress+headerSize;

	if (isOpen())
		stream.seekp(physicalAddress);

	return true;
}